

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,ImS64 *p_scroll_v,
                       ImS64 size_avail_v,ImS64 size_contents_v,ImDrawFlags flags)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  long *plVar4;
  int iVar5;
  ImU32 col;
  ImU32 col_00;
  long lVar6;
  ImGuiCol idx;
  long lVar7;
  bool bVar8;
  float fVar9;
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  float fVar12;
  float fVar13;
  undefined1 auVar14 [12];
  uint uVar15;
  float fVar16;
  undefined4 uVar17;
  bool held;
  bool hovered;
  ImRect bb;
  bool local_da;
  bool local_d9;
  ImRect local_d8;
  float local_bc;
  float local_b8;
  float local_b4;
  ImGuiAxis local_b0;
  ImGuiID local_ac;
  undefined1 local_a8 [16];
  long *local_90;
  undefined1 local_88 [16];
  ulong local_78;
  undefined8 uStack_70;
  ulong local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  ImVec2 local_48;
  ImVec2 aIStack_40 [2];
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (pIVar1->SkipItems == false) {
    fVar12 = (bb_frame->Max).x - (bb_frame->Min).x;
    if (fVar12 <= 0.0) {
      return false;
    }
    fVar9 = (bb_frame->Max).y - (bb_frame->Min).y;
    if (fVar9 <= 0.0) {
      return false;
    }
    fVar16 = 1.0;
    uVar17 = 0;
    if (axis == ImGuiAxis_Y) {
      fVar13 = (GImGui->Style).FramePadding.y;
      fVar13 = fVar13 + fVar13;
      if (fVar9 < fVar13 + GImGui->FontSize) {
        fVar13 = (fVar9 - GImGui->FontSize) / fVar13;
        auVar14 = ZEXT812(0x3f800000);
        if (fVar13 <= 1.0) {
          auVar14._4_8_ = 0;
          auVar14._0_4_ = fVar13;
        }
        fVar16 = (float)(~-(uint)(fVar13 < 0.0) & auVar14._0_4_);
        uVar17 = auVar14._8_4_;
      }
    }
    if (0.0 < fVar16) {
      local_58._4_4_ = 0;
      local_58._0_4_ = fVar16;
      local_58._8_4_ = uVar17;
      local_58._12_4_ = 0;
      uVar15 = 0;
      fVar12 = (fVar12 + -2.0) * 0.5;
      iVar5 = (int)fVar12;
      fVar13 = -3.0;
      fVar16 = -3.0;
      if (iVar5 < 4) {
        fVar16 = -(float)(int)fVar12;
      }
      fVar12 = -0.0;
      if (-1 < iVar5) {
        fVar12 = fVar16;
      }
      fVar9 = (fVar9 + -2.0) * 0.5;
      iVar5 = (int)fVar9;
      if (iVar5 < 4) {
        fVar13 = -(float)(int)fVar9;
      }
      fVar9 = -0.0;
      if (-1 < iVar5) {
        fVar9 = fVar13;
      }
      local_d8.Min.x = (bb_frame->Min).x;
      local_d8.Min.y = (bb_frame->Min).y;
      local_d8.Min.x = local_d8.Min.x - fVar12;
      local_d8.Min.y = local_d8.Min.y - fVar9;
      local_d8.Max.x = (bb_frame->Max).x;
      local_d8.Max.x = fVar12 + local_d8.Max.x;
      local_d8.Max.y = (bb_frame->Max).y;
      local_d8.Max.y = fVar9 + local_d8.Max.y;
      if (axis == ImGuiAxis_X) {
        local_bc = local_d8.Max.x - local_d8.Min.x;
      }
      else {
        local_bc = local_d8.Max.y - local_d8.Min.y;
      }
      lVar7 = size_contents_v - size_avail_v;
      if (lVar7 == 0 || size_contents_v < size_avail_v) {
        size_contents_v = size_avail_v;
      }
      local_b0 = axis;
      local_90 = p_scroll_v;
      if (0 < size_contents_v) {
        local_a8 = ZEXT416((uint)(GImGui->Style).GrabMinSize);
        local_da = false;
        local_d9 = false;
        local_ac = id;
        ButtonBehavior(&local_d8,id,&local_d9,&local_da,0x40000);
        plVar4 = local_90;
        lVar6 = 1;
        if (1 < lVar7) {
          lVar6 = lVar7;
        }
        fVar9 = ((float)size_avail_v / (float)size_contents_v) * local_bc;
        fVar12 = local_bc;
        if (fVar9 <= local_bc) {
          fVar12 = fVar9;
        }
        fVar16 = (float)lVar6;
        fVar12 = (float)(-(uint)(fVar9 < (float)local_a8._0_4_) & local_a8._0_4_ |
                        ~-(uint)(fVar9 < (float)local_a8._0_4_) & (uint)fVar12);
        local_68 = (ulong)(uint)fVar12;
        fVar9 = (float)*local_90 / fVar16;
        auVar10 = ZEXT812(0x3f800000);
        if (fVar9 <= 1.0) {
          auVar10._4_8_ = 0;
          auVar10._0_4_ = fVar9;
        }
        fVar13 = local_bc - fVar12;
        local_a8._4_4_ = 0;
        local_a8._0_4_ = ((float)(~-(uint)(fVar9 < 0.0) & auVar10._0_4_) * fVar13) / local_bc;
        local_a8._8_4_ = ~uVar15 & auVar10._8_4_;
        local_a8._12_4_ = 0;
        uStack_60 = 0;
        if (((1.0 <= (float)local_58._0_4_) && (fVar12 = fVar12 / local_bc, fVar12 < 1.0)) &&
           (local_da != false)) {
          uStack_70 = 0;
          local_b8 = fVar13;
          local_b4 = fVar16;
          local_78 = (ulong)(uint)fVar12;
          if (1 < (uint)local_b0) {
            __assert_fail("idx <= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                          ,0x105,"float &ImVec2::operator[](size_t)");
          }
          fVar12 = (*(float *)((pIVar3->IO).MouseDown + (ulong)(uint)local_b0 * 4 + -8) -
                   (&local_d8.Min.x)[(uint)local_b0]) / local_bc;
          auVar11 = ZEXT812(0x3f800000);
          if (fVar12 <= 1.0) {
            auVar11._4_8_ = 0;
            auVar11._0_4_ = fVar12;
          }
          local_88._0_4_ = ~-(uint)(fVar12 < 0.0) & auVar11._0_4_;
          local_88._4_4_ = 0;
          local_88._8_4_ = auVar11._8_4_;
          local_88._12_4_ = 0;
          SetHoveredID(local_ac);
          if (pIVar3->ActiveIdIsJustActivated == true) {
            bVar2 = (float)local_78 + (float)local_a8._0_4_ < (float)local_88._0_4_;
            bVar8 = bVar2 || (float)local_88._0_4_ < (float)local_a8._0_4_;
            fVar12 = 0.0;
            if (!bVar2 && (float)local_88._0_4_ >= (float)local_a8._0_4_) {
              fVar12 = (float)local_78 * -0.5 + ((float)local_88._0_4_ - (float)local_a8._0_4_);
            }
            pIVar3->ScrollbarClickDeltaToGrabCenter = fVar12;
          }
          else {
            bVar8 = false;
          }
          fVar9 = ((float)local_78 * -0.5 +
                  ((float)local_88._0_4_ - pIVar3->ScrollbarClickDeltaToGrabCenter)) /
                  (1.0 - (float)local_78);
          fVar12 = 1.0;
          if (fVar9 <= 1.0) {
            fVar12 = fVar9;
          }
          lVar7 = (long)((float)(~-(uint)(fVar9 < 0.0) & (uint)fVar12) * local_b4);
          *plVar4 = lVar7;
          fVar9 = (float)lVar7 / local_b4;
          fVar12 = 1.0;
          if (fVar9 <= 1.0) {
            fVar12 = fVar9;
          }
          fVar12 = (local_b8 * (float)(~-(uint)(fVar9 < 0.0) & (uint)fVar12)) / local_bc;
          local_a8 = ZEXT416((uint)fVar12);
          if (bVar8) {
            pIVar3->ScrollbarClickDeltaToGrabCenter =
                 -(float)local_78 * 0.5 + ((float)local_88._0_4_ - fVar12);
          }
        }
        col = GetColorU32(0xe,1.0);
        idx = 0x11;
        if (local_da == false) {
          idx = (local_d9 & 1) + 0xf;
        }
        col_00 = GetColorU32(idx,(float)local_58._0_4_);
        ImDrawList::AddRectFilled
                  (pIVar1->DrawList,&bb_frame->Min,&bb_frame->Max,col,pIVar1->WindowRounding,flags);
        if (local_b0 == ImGuiAxis_X) {
          local_48.x = local_d8.Min.x + (local_d8.Max.x - local_d8.Min.x) * (float)local_a8._0_4_;
          aIStack_40[0].x = (float)local_68 + local_48.x;
          local_48.y = local_d8.Min.y;
          aIStack_40[0].y = local_d8.Max.y;
        }
        else {
          local_48.y = (local_d8.Max.y - local_d8.Min.y) * (float)local_a8._0_4_ + local_d8.Min.y;
          aIStack_40[0].x = local_d8.Max.x;
          aIStack_40[0].y = (float)local_68 + local_48.y;
          local_48.x = local_d8.Min.x;
        }
        ImDrawList::AddRectFilled
                  (pIVar1->DrawList,&local_48,aIStack_40,col_00,(pIVar3->Style).ScrollbarRounding,0)
        ;
        return local_da;
      }
      __assert_fail("ImMax(size_contents_v, size_avail_v) > 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_widgets.cpp"
                    ,0x3b5,
                    "bool ImGui::ScrollbarEx(const ImRect &, ImGuiID, ImGuiAxis, ImS64 *, ImS64, ImS64, ImDrawFlags)"
                   );
    }
  }
  return false;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, ImS64* p_scroll_v, ImS64 size_avail_v, ImS64 size_contents_v, ImDrawFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the window resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp(IM_FLOOR((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp(IM_FLOOR((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = (axis == ImGuiAxis_X) ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const ImS64 win_size_v = ImMax(ImMax(size_contents_v, size_avail_v), (ImS64)1);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * ((float)size_avail_v / (float)win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    const ImS64 scroll_max = ImMax((ImS64)1, size_contents_v - size_avail_v);
    float scroll_ratio = ImSaturate((float)*p_scroll_v / (float)scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v; // Grab position in normalized space
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        const float scrollbar_pos_v = bb.Min[axis];
        const float mouse_pos_v = g.IO.MousePos[axis];

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            seek_absolute = (clicked_v_norm < grab_v_norm || clicked_v_norm > grab_v_norm + grab_h_norm);
            if (seek_absolute)
                g.ScrollbarClickDeltaToGrabCenter = 0.0f;
            else
                g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
        }

        // Apply scroll (p_scroll_v will generally point on one member of window->Scroll)
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
        *p_scroll_v = (ImS64)(scroll_v_norm * scroll_max);

        // Update values for rendering
        scroll_ratio = ImSaturate((float)*p_scroll_v / (float)scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    const ImU32 bg_col = GetColorU32(ImGuiCol_ScrollbarBg);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, bg_col, window->WindowRounding, flags);
    ImRect grab_rect;
    if (axis == ImGuiAxis_X)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}